

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O2

void __thiscall
Bech32Test_encode_good_Test::~Bech32Test_encode_good_Test(Bech32Test_encode_good_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, encode_good) {
    std::string hrp = "a";
    std::vector<unsigned char> data;
    std::string b = bech32::encode(hrp, data);
    ASSERT_EQ(b, "a1lqfn3a");

    hrp = "A";
    b = bech32::encode(hrp, data);
    ASSERT_EQ(b, "a1lqfn3a");
}